

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

String * kj::_::operator*(String *__return_storage_ptr__,undefined8 *param_2)

{
  long lVar1;
  undefined8 uVar2;
  StringPtr local_78;
  char *local_68;
  undefined8 local_60;
  long local_58;
  undefined8 uStack_50;
  undefined8 *local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  char *local_30;
  undefined8 local_28;
  long local_20;
  undefined8 uStack_18;
  undefined8 *local_10;
  
  local_40 = *param_2;
  uStack_38 = param_2[1];
  local_30 = ", ";
  local_28 = 3;
  local_20 = 0;
  uStack_18 = 0;
  local_10 = (undefined8 *)0x0;
  local_78.content.ptr = (char *)param_2[2];
  local_78.content.size_ = param_2[3];
  local_68 = ", ";
  local_60 = 3;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = (undefined8 *)0x0;
  concat<kj::_::Delimited<kj::ArrayPtr<unsigned_char>>,kj::StringPtr&,kj::_::Delimited<kj::ArrayPtr<unsigned_char>>>
            (__return_storage_ptr__,(_ *)&local_40,
             (Delimited<kj::ArrayPtr<unsigned_char>_> *)(param_2 + 4),&local_78,
             (Delimited<kj::ArrayPtr<unsigned_char>_> *)0x0);
  uVar2 = uStack_50;
  lVar1 = local_58;
  if (local_58 != 0) {
    local_58 = 0;
    uStack_50 = 0;
    (**(code **)*local_48)(local_48,lVar1,0x10,uVar2,uVar2,0);
  }
  uVar2 = uStack_18;
  lVar1 = local_20;
  if (local_20 != 0) {
    local_20 = 0;
    uStack_18 = 0;
    (**(code **)*local_10)(local_10,lVar1,0x10,uVar2,uVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}